

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseAssembler::embedDataArray
          (BaseAssembler *this,TypeId typeId,void *data,size_t itemCount,size_t repeatCount)

{
  Section *pSVar1;
  Logger *pLVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  Error err;
  Error extraout_EAX;
  Error EVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 *puVar10;
  size_t sVar11;
  uint8_t *__dest;
  StringTmp<512UL> sb;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *puStack_240;
  undefined1 local_238 [520];
  
  EVar7 = 0;
  cVar6 = (((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * '\x02' +
          '\x06';
  if ((typeId & 0xfe) != _kBaseStart) {
    cVar6 = '\0';
  }
  if ((byte)((cVar6 + typeId) - 0x20) < 0x45) {
    if (repeatCount != 0 && itemCount != 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = itemCount;
      uVar8 = SUB168(auVar3 * ZEXT116((byte)TypeUtils::_typeData
                                            [(ulong)(byte)(cVar6 + typeId) + 0x100]),0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar8;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = repeatCount;
      uVar9 = SUB168(auVar4 * auVar5,0);
      if ((SUB168(auVar3 * ZEXT116((byte)TypeUtils::_typeData[(ulong)(byte)(cVar6 + typeId) + 0x100]
                                  ),8) != 0) || (SUB168(auVar4 * auVar5,8) != 0)) {
        EVar7 = 1;
        goto LAB_00115ab3;
      }
      __dest = this->_bufferPtr;
      EVar7 = 0;
      if ((ulong)((long)this->_bufferEnd - (long)__dest) < uVar9) {
        err = CodeHolder::growBuffer((this->super_BaseEmitter)._code,&this->_section->_buffer,uVar9)
        ;
        if (err != 0) goto LAB_00115b16;
        __dest = this->_bufferPtr;
        goto LAB_00115b01;
      }
      while (EVar7 == 0) {
        if (repeatCount == 0) {
LAB_001159c0:
          pSVar1 = this->_section;
          uVar9 = (long)__dest - (long)this->_bufferData;
          if (uVar9 <= (pSVar1->_buffer)._capacity) {
            this->_bufferPtr = __dest;
            uVar8 = (pSVar1->_buffer)._size;
            if (uVar9 < uVar8) {
              uVar9 = uVar8;
            }
            (pSVar1->_buffer)._size = uVar9;
            pLVar2 = (this->super_BaseEmitter)._logger;
            if (pLVar2 == (Logger *)0x0) {
              return 0;
            }
            puStack_240 = local_238;
            uStack_250 = 0;
            local_258 = 0x20;
            local_248 = 0x207;
            local_238[0] = 0;
            Formatter::formatData
                      ((String *)&local_258,(pLVar2->_options)._flags,
                       (this->super_BaseEmitter)._environment._arch,typeId,data,itemCount,
                       repeatCount);
            String::_opChar((String *)&local_258,kAppend,'\n');
            pLVar2 = (this->super_BaseEmitter)._logger;
            uVar8 = uStack_250;
            puVar10 = puStack_240;
            if ((local_258 & 0xff) < 0x1f) {
              uVar8 = local_258 & 0xff;
              puVar10 = (undefined1 *)((long)&local_258 + 1);
            }
            (*pLVar2->_vptr_Logger[2])(pLVar2,puVar10,uVar8);
            String::reset((String *)&local_258);
            return 0;
          }
          embedDataArray();
        }
        else {
          sVar11 = repeatCount;
          if (uVar8 != 0) {
            do {
              memcpy(__dest,data,uVar8);
              __dest = __dest + uVar8;
              sVar11 = sVar11 - 1;
            } while (sVar11 != 0);
            goto LAB_001159c0;
          }
        }
        embedDataArray();
        err = extraout_EAX;
LAB_00115b16:
        EVar7 = BaseEmitter::reportError(&this->super_BaseEmitter,err,(char *)0x0);
LAB_00115b01:
        if (err == 0) {
          EVar7 = 0;
        }
      }
    }
    return EVar7;
  }
  EVar7 = 2;
LAB_00115ab3:
  EVar7 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar7,(char *)0x0);
  return EVar7;
}

Assistant:

Error BaseAssembler::embedDataArray(TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (itemCount == 0 || repeatCount == 0)
    return kErrorOk;

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  size_t totalSize = Support::mulOverflow(dataSize, repeatCount, &of);

  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, totalSize));

  for (size_t i = 0; i < repeatCount; i++)
    writer.emitData(data, dataSize);

  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), typeId, data, itemCount, repeatCount);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}